

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O2

void __thiscall FBaseCVar::~FBaseCVar(FBaseCVar *this)

{
  char *var_name;
  FBaseCVar *in_RAX;
  FBaseCVar *pFVar1;
  FBaseCVar **ppFVar2;
  FBaseCVar *prev;
  FBaseCVar *local_18;
  
  this->_vptr_FBaseCVar = (_func_int **)&PTR__FBaseCVar_006ebe30;
  var_name = this->Name;
  if (var_name != (char *)0x0) {
    local_18 = in_RAX;
    pFVar1 = FindCVar(var_name,&local_18);
    if (pFVar1 == this) {
      ppFVar2 = &CVars;
      if (local_18 != (FBaseCVar *)0x0) {
        ppFVar2 = &local_18->m_Next;
      }
      *ppFVar2 = this->m_Next;
    }
    C_RemoveTabCommand(var_name);
    if (this->Name != (char *)0x0) {
      operator_delete__(this->Name);
    }
  }
  return;
}

Assistant:

FBaseCVar::~FBaseCVar ()
{
	if (Name)
	{
		FBaseCVar *var, *prev;

		var = FindCVar (Name, &prev);

		if (var == this)
		{
			if (prev)
				prev->m_Next = m_Next;
			else
				CVars = m_Next;
		}
		C_RemoveTabCommand(Name);
		delete[] Name;
	}
}